

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_find(_glist *x,t_symbol *s,t_floatarg wholeword)

{
  char *text;
  uint uVar1;
  t_symbol *ptVar2;
  _binbuf *p_Var3;
  size_t size;
  t_symbol *decodedsym;
  uint local_20;
  int found;
  int myindex;
  t_floatarg wholeword_local;
  t_symbol *s_local;
  _glist *x_local;
  
  local_20 = 0;
  found = (int)wholeword;
  _myindex = s;
  s_local = (t_symbol *)x;
  ptVar2 = sys_decodedialog(s);
  if (*(long *)((pd_maininstance.pd_gui)->i_editor + 0x60) == 0) {
    p_Var3 = binbuf_new();
    *(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60) = p_Var3;
  }
  p_Var3 = *(_binbuf **)((pd_maininstance.pd_gui)->i_editor + 0x60);
  text = ptVar2->s_name;
  size = strlen(ptVar2->s_name);
  binbuf_text(p_Var3,text,size);
  *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x58) = 0;
  *(int *)((pd_maininstance.pd_gui)->i_editor + 0x5c) = (int)(float)found;
  canvas_whichfind = (_glist *)s_local;
  uVar1 = canvas_dofind((_glist *)s_local,(int *)&local_20);
  if (uVar1 != 0) {
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x58) = 1;
  }
  pdgui_vmess("pdtk_showfindresult","^ iii",s_local,(ulong)uVar1,
              (ulong)*(uint *)((pd_maininstance.pd_gui)->i_editor + 0x58),(ulong)local_20);
  return;
}

Assistant:

static void canvas_find(t_canvas *x, t_symbol *s, t_floatarg wholeword)
{
    int myindex = 0, found;
    t_symbol *decodedsym = sys_decodedialog(s);
    if (!EDITOR->canvas_findbuf)
        EDITOR->canvas_findbuf = binbuf_new();
    binbuf_text(EDITOR->canvas_findbuf, decodedsym->s_name,
        strlen(decodedsym->s_name));
    EDITOR->canvas_find_index = 0;
    EDITOR->canvas_find_wholeword = wholeword;
    canvas_whichfind = x;
    found = canvas_dofind(x, &myindex);
    if (found)
        EDITOR->canvas_find_index = 1;
    pdgui_vmess("pdtk_showfindresult", "^ iii",
        x,
        found, EDITOR->canvas_find_index, myindex);
}